

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::ImageViewCreateInfo::ImageViewCreateInfo
          (ImageViewCreateInfo *this,VkImage _image,VkImageViewType _viewType,VkFormat _format,
          VkComponentMapping *_components,VkImageViewCreateFlags _flags)

{
  VkImageSubresourceRange local_4c;
  TextureFormat local_38;
  TextureFormat tcuFormat;
  VkImageAspectFlags aspectFlags;
  VkImageViewCreateFlags _flags_local;
  VkComponentMapping *_components_local;
  VkFormat _format_local;
  VkImageViewType _viewType_local;
  ImageViewCreateInfo *this_local;
  VkImage _image_local;
  
  tcuFormat.type = _flags;
  ::vk::VkImageViewCreateInfo::VkImageViewCreateInfo(&this->super_VkImageViewCreateInfo);
  (this->super_VkImageViewCreateInfo).sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  (this->super_VkImageViewCreateInfo).pNext = (void *)0x0;
  (this->super_VkImageViewCreateInfo).flags = 0;
  (this->super_VkImageViewCreateInfo).image.m_internal = _image.m_internal;
  (this->super_VkImageViewCreateInfo).viewType = _viewType;
  (this->super_VkImageViewCreateInfo).format = _format;
  (this->super_VkImageViewCreateInfo).components.r = _components->r;
  (this->super_VkImageViewCreateInfo).components.g = _components->g;
  (this->super_VkImageViewCreateInfo).components.b = _components->b;
  (this->super_VkImageViewCreateInfo).components.a = _components->a;
  local_38 = ::vk::mapVkFormat(_format);
  if (local_38.order == D) {
    tcuFormat.order = I;
  }
  else if (local_38.order == S) {
    tcuFormat.order = LA;
  }
  else if (local_38.order == DS) {
    tcuFormat.order = RA;
  }
  else {
    tcuFormat.order = A;
  }
  ImageSubresourceRange::ImageSubresourceRange
            ((ImageSubresourceRange *)&local_4c,tcuFormat.order,0,1,0,1);
  (this->super_VkImageViewCreateInfo).subresourceRange.aspectMask = local_4c.aspectMask;
  (this->super_VkImageViewCreateInfo).subresourceRange.baseMipLevel = local_4c.baseMipLevel;
  (this->super_VkImageViewCreateInfo).subresourceRange.levelCount = local_4c.levelCount;
  (this->super_VkImageViewCreateInfo).subresourceRange.baseArrayLayer = local_4c.baseArrayLayer;
  (this->super_VkImageViewCreateInfo).subresourceRange.layerCount = local_4c.layerCount;
  (this->super_VkImageViewCreateInfo).flags = tcuFormat.type;
  return;
}

Assistant:

ImageViewCreateInfo::ImageViewCreateInfo (vk::VkImage					_image,
										  vk::VkImageViewType			_viewType,
										  vk::VkFormat					_format,
										  const vk::VkComponentMapping&	_components,
										  vk::VkImageViewCreateFlags	_flags)
{
	sType = vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
	pNext = DE_NULL;
	flags			= 0u;
	image			= _image;
	viewType		= _viewType;
	format			= _format;
	components.r	= _components.r;
	components.g	= _components.g;
	components.b	= _components.b;
	components.a	= _components.a;

	vk::VkImageAspectFlags aspectFlags;
	const tcu::TextureFormat tcuFormat = vk::mapVkFormat(_format);

	switch (tcuFormat.order)
	{
		case tcu::TextureFormat::D:
			aspectFlags = vk::VK_IMAGE_ASPECT_DEPTH_BIT;
			break;
		case tcu::TextureFormat::S:
			aspectFlags = vk::VK_IMAGE_ASPECT_STENCIL_BIT;
			break;
		case tcu::TextureFormat::DS:
			aspectFlags = vk::VK_IMAGE_ASPECT_STENCIL_BIT | vk::VK_IMAGE_ASPECT_DEPTH_BIT;
			break;
		default:
			aspectFlags = vk::VK_IMAGE_ASPECT_COLOR_BIT;
			break;
	}

	subresourceRange = ImageSubresourceRange(aspectFlags);;
	flags = _flags;
}